

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void MyDocument::DisplayContextMenu(MyDocument *doc)

{
  bool bVar1;
  MyDocument *in_RDI;
  char buf [256];
  char *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  ImGuiPopupFlags in_stack_ffffffffffffff14;
  char *in_stack_ffffffffffffff18;
  
  bVar1 = ImGui::BeginPopupContextItem(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
  if (bVar1) {
    sprintf(&stack0xfffffffffffffef8,"Save %s",in_RDI->Name);
    bVar1 = ImGui::MenuItem(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,false,false);
    if (bVar1) {
      DoSave(in_RDI);
    }
    bVar1 = ImGui::MenuItem(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,false,false);
    if (bVar1) {
      DoQueueClose(in_RDI);
    }
    ImGui::EndPopup();
  }
  return;
}

Assistant:

static void DisplayContextMenu(MyDocument* doc)
    {
        if (!ImGui::BeginPopupContextItem())
            return;

        char buf[256];
        sprintf(buf, "Save %s", doc->Name);
        if (ImGui::MenuItem(buf, "CTRL+S", false, doc->Open))
            doc->DoSave();
        if (ImGui::MenuItem("Close", "CTRL+W", false, doc->Open))
            doc->DoQueueClose();
        ImGui::EndPopup();
    }